

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O3

uv_os_sock_t create_bound_socket(sockaddr_in bind_addr)

{
  long *plVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uv_os_sock_t extraout_EAX;
  uv_os_sock_t extraout_EAX_00;
  uv_os_sock_t extraout_EAX_01;
  uv_os_sock_t extraout_EAX_02;
  connection_context_t *pcVar6;
  void *pvVar7;
  ssize_t sVar8;
  ulong uVar9;
  int *piVar10;
  long extraout_RAX;
  long lVar11;
  uint extraout_EDX;
  ulong unaff_RBX;
  sockaddr *__addr;
  void *pvVar12;
  long *plVar13;
  long *plVar14;
  long *plVar15;
  undefined8 *__ptr;
  size_t sVar16;
  int yes;
  socklen_t sStack_44;
  sockaddr sStack_40;
  code *pcStack_30;
  undefined4 local_1c;
  sockaddr local_18;
  
  plVar13 = (long *)0x2;
  pcStack_30 = (code *)0x173cdd;
  uVar2 = socket(2,1,0);
  if ((int)uVar2 < 0) {
    pcStack_30 = (code *)0x173d2b;
    create_bound_socket_cold_1();
LAB_00173d2b:
    pcStack_30 = (code *)0x173d30;
    create_bound_socket_cold_2();
  }
  else {
    unaff_RBX = (ulong)uVar2;
    local_1c = 1;
    plVar13 = (long *)(ulong)uVar2;
    pcStack_30 = (code *)0x173d05;
    iVar3 = setsockopt(uVar2,1,2,&local_1c,4);
    if (iVar3 != 0) goto LAB_00173d2b;
    plVar13 = (long *)(ulong)uVar2;
    pcStack_30 = (code *)0x173d1a;
    iVar3 = bind(uVar2,&local_18,0x10);
    if (iVar3 == 0) {
      return uVar2;
    }
  }
  pcStack_30 = server_poll_cb;
  create_bound_socket_cold_3();
  lVar11 = *plVar13;
  sStack_44 = 0x10;
  pcVar6 = (connection_context_t *)(ulong)*(uint *)(lVar11 + 0xa0);
  __addr = &sStack_40;
  pcStack_30 = (code *)unaff_RBX;
  iVar3 = accept(*(uint *)(lVar11 + 0xa0),__addr,&sStack_44);
  iVar4 = (int)__addr;
  if (iVar3 < 0) {
    server_poll_cb_cold_1();
  }
  else {
    pcVar6 = create_connection_context(iVar3,1);
    pcVar6->events = 7;
    iVar4 = 7;
    iVar3 = uv_poll_start(pcVar6,7,connection_poll_cb);
    if (iVar3 == 0) {
      iVar3 = *(int *)(lVar11 + 0xa4) + 1;
      *(int *)(lVar11 + 0xa4) = iVar3;
      if (iVar3 == 5) {
        close_socket(*(uv_os_sock_t *)(lVar11 + 0xa0));
        iVar3 = uv_close(lVar11,server_close_cb);
      }
      return iVar3;
    }
  }
  server_poll_cb_cold_2();
  plVar13 = (long *)0x170;
  iVar3 = iVar4;
  pvVar7 = malloc(0x170);
  if (pvVar7 == (void *)0x0) {
    create_connection_context_cold_3();
LAB_00173e5f:
    create_connection_context_cold_1();
  }
  else {
    *(int *)((long)pvVar7 + 0x138) = (int)pcVar6;
    *(int *)((long)pvVar7 + 0x150) = iVar4;
    *(undefined8 *)((long)pvVar7 + 0x140) = 0;
    *(undefined8 *)((long)pvVar7 + 0x148) = 0;
    *(undefined8 *)((long)pvVar7 + 0x154) = 0;
    *(undefined8 *)((long)pvVar7 + 0x15c) = 0;
    *(undefined8 *)((long)pvVar7 + 0x164) = 0;
    plVar13 = (long *)uv_default_loop();
    pvVar12 = pvVar7;
    iVar4 = uv_poll_init_socket(plVar13,pvVar7,(ulong)pcVar6 & 0xffffffff);
    iVar3 = (int)pvVar12;
    *(int *)((long)pvVar7 + 0x154) = *(int *)((long)pvVar7 + 0x154) + 1;
    *(void **)pvVar7 = pvVar7;
    if (iVar4 != 0) goto LAB_00173e5f;
    plVar13 = (long *)uv_default_loop();
    iVar3 = (int)pvVar7 + 0xa0;
    iVar4 = uv_timer_init();
    *(int *)((long)pvVar7 + 0x154) = *(int *)((long)pvVar7 + 0x154) + 1;
    *(void **)((long)pvVar7 + 0xa0) = pvVar7;
    if (iVar4 == 0) {
      return (int)pvVar7;
    }
  }
  create_connection_context_cold_2();
  plVar14 = plVar13;
  if (iVar3 == 0) {
    plVar1 = (long *)*plVar13;
    uVar2 = *(uint *)((long)plVar1 + 0x164);
    if ((uVar2 & extraout_EDX) == 0) goto LAB_00174405;
    if ((~uVar2 & extraout_EDX) != 0) goto LAB_0017440a;
    if ((extraout_EDX & 1) == 0) goto switchD_00174010_caseD_4;
    iVar3 = rand();
    switch(iVar3 % 7) {
    case 0:
    case 1:
      do {
        plVar14 = (long *)(ulong)*(uint *)(plVar1 + 0x27);
        sVar8 = recv(*(uint *)(plVar1 + 0x27),connection_poll_cb::buffer,0x4a,0);
        uVar5 = (uint)sVar8;
        if (uVar5 != 0xffffffff) {
          if (-1 < (int)uVar5) {
            if (uVar5 == 0) goto LAB_00174167;
            plVar1[0x28] = plVar1[0x28] + (ulong)(uVar5 & 0x7fffffff);
            goto switchD_00174010_caseD_4;
          }
          break;
        }
        piVar10 = __errno_location();
      } while (*piVar10 == 4);
      connection_poll_cb_cold_4();
      goto LAB_00174047;
    case 2:
    case 3:
      do {
        while( true ) {
          plVar14 = (long *)(ulong)*(uint *)(plVar1 + 0x27);
          sVar8 = recv(*(uint *)(plVar1 + 0x27),connection_poll_cb::buffer_1,0x3a3,0);
          uVar5 = (uint)sVar8;
          if (uVar5 == 0xffffffff) break;
          if ((int)uVar5 < 1) {
            if (uVar5 == 0) goto LAB_00174167;
            piVar10 = __errno_location();
            iVar3 = *piVar10;
            goto LAB_00174150;
          }
          plVar1[0x28] = plVar1[0x28] + (ulong)(uVar5 & 0x7fffffff);
        }
        piVar10 = __errno_location();
        iVar3 = *piVar10;
      } while (iVar3 == 4);
LAB_00174150:
      if ((iVar3 != 0xb) && (iVar3 != 0x73)) {
        connection_poll_cb_cold_3();
LAB_00174167:
        *(undefined4 *)(plVar1 + 0x2b) = 1;
        uVar2 = uVar2 & 0xfffffffe;
      }
      break;
    case 4:
      break;
    case 5:
      uVar2 = uVar2 & 0xfffffffe;
      plVar14 = plVar1 + 0x14;
      plVar15 = plVar14;
      iVar3 = uv_is_active();
      if (iVar3 == 0) {
        *(undefined4 *)(plVar1 + 0x2d) = 1;
        uv_timer_start(plVar14,delay_timer_cb,10,0);
      }
      else {
        *(byte *)(plVar1 + 0x2d) = *(byte *)(plVar1 + 0x2d) | 1;
        plVar14 = plVar15;
      }
      break;
    case 6:
      uv_poll_start(plVar1,2,connection_poll_cb);
      plVar14 = plVar1;
      uv_poll_start(plVar1,1,connection_poll_cb);
      *(undefined4 *)((long)plVar1 + 0x164) = 1;
      break;
    default:
      goto switchD_00174010_default;
    }
switchD_00174010_caseD_4:
    if ((extraout_EDX & 2) == 0) goto switchD_00174088_caseD_4;
    if (((ulong)plVar1[0x29] < 0x10000) && ((test_mode != '\x01' || (*(int *)(plVar1 + 0x2a) == 0)))
       ) {
LAB_00174047:
      iVar3 = rand();
      switch(iVar3 % 7) {
      case 0:
      case 1:
        uVar9 = -(plVar1[0x29] + -0x10000);
        sVar16 = 0x67;
        if (uVar9 < 0x67) {
          sVar16 = uVar9;
        }
        if (plVar1[0x29] != 0x10000) {
          do {
            plVar14 = (long *)(ulong)*(uint *)(plVar1 + 0x27);
            sVar8 = send(*(uint *)(plVar1 + 0x27),connection_poll_cb::buffer_2,sVar16,0);
            uVar5 = (uint)sVar8;
            if (uVar5 != 0xffffffff) {
              if (-1 < (int)uVar5) {
                if (uVar5 == 0) goto LAB_00174437;
                plVar1[0x29] = plVar1[0x29] + (ulong)(uVar5 & 0x7fffffff);
                valid_writable_wakeups = valid_writable_wakeups + 1;
                goto switchD_00174088_caseD_4;
              }
              piVar10 = __errno_location();
              iVar3 = *piVar10;
              break;
            }
            piVar10 = __errno_location();
            iVar3 = *piVar10;
          } while (iVar3 == 4);
          if ((iVar3 != 0xb) && (iVar3 != 0x73)) {
            connection_poll_cb_cold_13();
LAB_0017439c:
            piVar10 = __errno_location();
            iVar3 = *piVar10;
            goto LAB_001743a3;
          }
LAB_001743b1:
          spurious_writable_wakeups = spurious_writable_wakeups + 1;
          break;
        }
        goto LAB_00174423;
      case 2:
      case 3:
        sVar16 = -(plVar1[0x29] + -0x10000);
        if (0x4d1 < sVar16) {
          sVar16 = 0x4d2;
        }
        if (plVar1[0x29] == 0x10000) goto LAB_00174428;
        do {
          plVar14 = (long *)(ulong)*(uint *)(plVar1 + 0x27);
          sVar8 = send(*(uint *)(plVar1 + 0x27),connection_poll_cb::buffer_3,sVar16,0);
          uVar5 = (uint)sVar8;
          if (uVar5 != 0xffffffff) {
            if ((int)uVar5 < 0) goto LAB_0017439c;
            if (uVar5 == 0) goto LAB_0017443c;
            valid_writable_wakeups = valid_writable_wakeups + 1;
            uVar9 = (ulong)(uVar5 & 0x7fffffff) + plVar1[0x29];
            plVar1[0x29] = uVar9;
            goto joined_r0x001742aa;
          }
          piVar10 = __errno_location();
          iVar3 = *piVar10;
        } while (iVar3 == 4);
LAB_001743a3:
        if ((iVar3 == 0xb) || (iVar3 == 0x73)) goto LAB_001743b1;
        goto LAB_00174432;
      case 4:
        break;
      case 5:
        uVar2 = uVar2 & 0xfffffffd;
        iVar3 = uv_is_active(plVar1 + 0x14);
        if (iVar3 == 0) {
          *(undefined4 *)(plVar1 + 0x2d) = 2;
          uv_timer_start(plVar1 + 0x14,delay_timer_cb,100,0);
        }
        else {
          *(byte *)(plVar1 + 0x2d) = *(byte *)(plVar1 + 0x2d) | 2;
        }
        break;
      case 6:
        uv_poll_start(plVar1,1,connection_poll_cb);
        uv_poll_start(plVar1,2,connection_poll_cb);
        *(undefined4 *)((long)plVar1 + 0x164) = 2;
        break;
      default:
        goto switchD_00174088_default;
      }
switchD_00174088_caseD_4:
      if ((extraout_EDX & 4) != 0) {
        *(undefined4 *)(plVar1 + 0x2c) = 1;
        disconnects = disconnects + 1;
        uVar2 = uVar2 & 0xfffffffb;
      }
      if (((*(int *)(plVar1 + 0x2b) == 0) || (*(int *)((long)plVar1 + 0x15c) == 0)) ||
         (*(int *)(plVar1 + 0x2c) == 0)) {
        if (uVar2 != *(uint *)((long)plVar1 + 0x164)) {
          *(uint *)((long)plVar1 + 0x164) = uVar2;
          uv_poll_start(plVar13,uVar2,connection_poll_cb);
          uVar2 = *(uint *)((long)plVar1 + 0x164);
        }
        if (uVar2 != 0) {
          iVar3 = uv_is_active(plVar13);
          if (iVar3 == 1) {
            return 1;
          }
          connection_poll_cb_cold_16();
        }
      }
      else {
        close_socket(*(uv_os_sock_t *)(plVar1 + 0x27));
        uv_close(plVar1,connection_close_cb);
        uv_close(plVar1 + 0x14,connection_close_cb);
        *(undefined4 *)((long)plVar1 + 0x164) = 0;
      }
      iVar3 = uv_is_active();
      if (iVar3 == 0) {
        return 0;
      }
      goto LAB_0017440f;
    }
    plVar14 = (long *)(ulong)*(uint *)(plVar1 + 0x27);
    iVar3 = shutdown(*(uint *)(plVar1 + 0x27),1);
    if (iVar3 == 0) {
      *(undefined4 *)((long)plVar1 + 0x15c) = 1;
      uVar2 = uVar2 & 0xfffffffd;
      goto switchD_00174088_caseD_4;
    }
  }
  else {
LAB_00174400:
    connection_poll_cb_cold_1();
    plVar13 = plVar14;
LAB_00174405:
    connection_poll_cb_cold_18();
LAB_0017440a:
    connection_poll_cb_cold_2();
LAB_0017440f:
    connection_poll_cb_cold_17();
    plVar14 = plVar13;
  }
  connection_poll_cb_cold_6();
LAB_00174419:
  connection_poll_cb_cold_7();
switchD_00174010_default:
  connection_poll_cb_cold_5();
LAB_00174423:
  connection_poll_cb_cold_14();
LAB_00174428:
  connection_poll_cb_cold_11();
switchD_00174088_default:
  connection_poll_cb_cold_15();
LAB_00174432:
  connection_poll_cb_cold_10();
LAB_00174437:
  connection_poll_cb_cold_12();
LAB_0017443c:
  connection_poll_cb_cold_9();
  iVar3 = close((int)plVar14);
  if ((iVar3 == 0) || (piVar10 = __errno_location(), *piVar10 == 0x68)) {
    return extraout_EAX;
  }
  close_socket_cold_1();
  plVar13 = (long *)*plVar14;
  iVar3 = uv_is_active();
  if (iVar3 == 0) {
    if (*(uint *)(plVar13 + 0x2d) == 0) goto LAB_001744a3;
    uVar2 = *(uint *)(plVar13 + 0x2d) | *(uint *)((long)plVar13 + 0x164);
    *(uint *)((long)plVar13 + 0x164) = uVar2;
    *(undefined4 *)(plVar13 + 0x2d) = 0;
    iVar3 = uv_poll_start(plVar13,uVar2,connection_poll_cb);
    if (iVar3 == 0) {
      return 0;
    }
  }
  else {
    delay_timer_cb_cold_1();
LAB_001744a3:
    plVar13 = plVar14;
    delay_timer_cb_cold_3();
  }
  delay_timer_cb_cold_2();
  __ptr = (undefined8 *)*plVar13;
  piVar10 = (int *)((long)__ptr + 0x154);
  *piVar10 = *piVar10 + -1;
  if (*piVar10 != 0) {
    return extraout_EAX_00;
  }
  if (test_mode == '\x01') {
    lVar11 = __ptr[0x28];
    if (*(int *)(__ptr + 0x2a) != 0) {
      if (lVar11 == 0x10000) {
        if (__ptr[0x29] == 0) goto LAB_0017450f;
        connection_close_cb_cold_2();
        goto LAB_001744eb;
      }
      goto LAB_001744f8;
    }
LAB_001744fd:
    if (lVar11 != 0) goto LAB_00174520;
  }
  else {
LAB_001744eb:
    if (__ptr[0x28] != 0x10000) {
LAB_001744f8:
      connection_close_cb_cold_1();
      lVar11 = extraout_RAX;
      goto LAB_001744fd;
    }
  }
  if (__ptr[0x29] == 0x10000) {
LAB_0017450f:
    closed_connections = closed_connections + 1;
    free(__ptr);
    return extraout_EAX_01;
  }
  connection_close_cb_cold_4();
LAB_00174520:
  connection_close_cb_cold_3();
  free((void *)*__ptr);
  return extraout_EAX_02;
joined_r0x001742aa:
  if (0xffff < uVar9) goto switchD_00174088_caseD_4;
  sVar16 = 0x10000 - uVar9;
  if (uVar9 < 0xfb2f) {
    sVar16 = 0x4d2;
  }
  while( true ) {
    plVar14 = (long *)(ulong)*(uint *)(plVar1 + 0x27);
    sVar8 = send(*(uint *)(plVar1 + 0x27),connection_poll_cb::buffer_3,sVar16,0);
    uVar5 = (uint)sVar8;
    if (uVar5 != 0xffffffff) break;
    piVar10 = __errno_location();
    iVar3 = *piVar10;
    if (iVar3 != 4) goto LAB_001743e9;
  }
  if (uVar5 == 0) goto LAB_00174419;
  if ((int)uVar5 < 0) {
    piVar10 = __errno_location();
    iVar3 = *piVar10;
LAB_001743e9:
    if ((iVar3 != 0xb) && (iVar3 != 0x73)) {
      connection_poll_cb_cold_8();
      goto LAB_00174400;
    }
    goto switchD_00174088_caseD_4;
  }
  uVar9 = (ulong)(uVar5 & 0x7fffffff) + plVar1[0x29];
  plVar1[0x29] = uVar9;
  goto joined_r0x001742aa;
}

Assistant:

static uv_os_sock_t create_bound_socket (struct sockaddr_in bind_addr) {
  uv_os_sock_t sock;
  int r;

  sock = socket(AF_INET, SOCK_STREAM, IPPROTO_IP);
#ifdef _WIN32
  ASSERT(sock != INVALID_SOCKET);
#else
  ASSERT(sock >= 0);
#endif

#ifndef _WIN32
  {
    /* Allow reuse of the port. */
    int yes = 1;
    r = setsockopt(sock, SOL_SOCKET, SO_REUSEADDR, &yes, sizeof yes);
    ASSERT(r == 0);
  }
#endif

  r = bind(sock, (const struct sockaddr*) &bind_addr, sizeof bind_addr);
  ASSERT(r == 0);

  return sock;
}